

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void run_recovery_tests(void)

{
  byte bVar1;
  secp256k1_context *psVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uStack_560;
  uchar sigbder [8];
  int32_t _calls_to_callback_4;
  void *pvStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  uchar msg32 [32];
  int recid_1;
  undefined1 uStack_4f4;
  undefined1 uStack_4f3;
  undefined1 uStack_4f2;
  undefined1 uStack_4f1;
  uchar auStack_4f0 [32];
  ulong local_4d0;
  uchar sigcder_zs [7];
  uchar sigcder_zr [7];
  secp256k1_pubkey recpubkey;
  int32_t _calls_to_callback_12;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined7 uStack_460;
  undefined1 uStack_459;
  undefined7 uStack_458;
  uchar privkey [32];
  uchar zero_privkey [32];
  secp256k1_ecdsa_signature normal_sig;
  int recid;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined7 uStack_370;
  undefined1 uStack_369;
  undefined7 uStack_368;
  uchar message [32];
  uchar sig [74];
  secp256k1_ecdsa_recoverable_signature local_296;
  secp256k1_ecdsa_recoverable_signature local_255;
  secp256k1_ecdsa_recoverable_signature local_214;
  secp256k1_pubkey pubkey;
  secp256k1_ecdsa_recoverable_signature recsig;
  secp256k1_ecdsa_signature local_78;
  
  iVar6 = 0;
  while( true ) {
    if (COUNT <= iVar6) break;
    privkey[0x10] = '\0';
    privkey[0x11] = '\0';
    privkey[0x12] = '\0';
    privkey[0x13] = '\0';
    privkey[0x14] = '\0';
    privkey[0x15] = '\0';
    privkey[0x16] = '\0';
    privkey[0x17] = '\0';
    privkey[0x18] = '\0';
    privkey[0x19] = '\0';
    privkey[0x1a] = '\0';
    privkey[0x1b] = '\0';
    privkey[0x1c] = '\0';
    privkey[0x1d] = '\0';
    privkey[0x1e] = '\0';
    privkey[0x1f] = '\0';
    privkey[0] = '\x01';
    privkey[1] = '\0';
    privkey[2] = '\0';
    privkey[3] = '\0';
    privkey[4] = '\0';
    privkey[5] = '\0';
    privkey[6] = '\0';
    privkey[7] = '\0';
    privkey[8] = '\0';
    privkey[9] = '\0';
    privkey[10] = '\0';
    privkey[0xb] = '\0';
    privkey[0xc] = '\0';
    privkey[0xd] = '\0';
    privkey[0xe] = '\0';
    privkey[0xf] = '\0';
    message[0x10] = '\0';
    message[0x11] = '\0';
    message[0x12] = '\0';
    message[0x13] = '\0';
    message[0x14] = '\0';
    message[0x15] = '\0';
    message[0x16] = '\0';
    message[0x17] = '\0';
    message[0x18] = '\0';
    message[0x19] = '\0';
    message[0x1a] = '\0';
    message[0x1b] = '\0';
    message[0x1c] = '\0';
    message[0x1d] = '\0';
    message[0x1e] = '\0';
    message[0x1f] = '\0';
    message[0] = '\x02';
    message[1] = '\0';
    message[2] = '\0';
    message[3] = '\0';
    message[4] = '\0';
    message[5] = '\0';
    message[6] = '\0';
    message[7] = '\0';
    message[8] = '\0';
    message[9] = '\0';
    message[10] = '\0';
    message[0xb] = '\0';
    message[0xc] = '\0';
    message[0xd] = '\0';
    message[0xe] = '\0';
    message[0xf] = '\0';
    _recid = _recid & 0xffffffff00000000;
    zero_privkey[0x10] = '\0';
    zero_privkey[0x11] = '\0';
    zero_privkey[0x12] = '\0';
    zero_privkey[0x13] = '\0';
    zero_privkey[0x14] = '\0';
    zero_privkey[0x15] = '\0';
    zero_privkey[0x16] = '\0';
    zero_privkey[0x17] = '\0';
    zero_privkey[0x18] = '\0';
    zero_privkey[0x19] = '\0';
    zero_privkey[0x1a] = '\0';
    zero_privkey[0x1b] = '\0';
    zero_privkey[0x1c] = '\0';
    zero_privkey[0x1d] = '\0';
    zero_privkey[0x1e] = '\0';
    zero_privkey[0x1f] = '\0';
    zero_privkey[0] = '\0';
    zero_privkey[1] = '\0';
    zero_privkey[2] = '\0';
    zero_privkey[3] = '\0';
    zero_privkey[4] = '\0';
    zero_privkey[5] = '\0';
    zero_privkey[6] = '\0';
    zero_privkey[7] = '\0';
    zero_privkey[8] = '\0';
    zero_privkey[9] = '\0';
    zero_privkey[10] = '\0';
    zero_privkey[0xb] = '\0';
    zero_privkey[0xc] = '\0';
    zero_privkey[0xd] = '\0';
    zero_privkey[0xe] = '\0';
    zero_privkey[0xf] = '\0';
    auStack_4f0[8] = 0xff;
    auStack_4f0[9] = 0xff;
    auStack_4f0[10] = 0xff;
    auStack_4f0[0xb] = 0xff;
    auStack_4f0[0xc] = 0xff;
    auStack_4f0[0xd] = 0xff;
    auStack_4f0[0xe] = 0xff;
    auStack_4f0[0xf] = 0xff;
    auStack_4f0[0x10] = 0xff;
    auStack_4f0[0x11] = 0xff;
    auStack_4f0[0x12] = 0xff;
    auStack_4f0[0x13] = 0xff;
    auStack_4f0[0x14] = 0xff;
    auStack_4f0[0x15] = 0xff;
    auStack_4f0[0x16] = 0xff;
    auStack_4f0[0x17] = 0xff;
    _recid_1 = 0xffffffffffffffff;
    auStack_4f0[0] = 0xff;
    auStack_4f0[1] = 0xff;
    auStack_4f0[2] = 0xff;
    auStack_4f0[3] = 0xff;
    auStack_4f0[4] = 0xff;
    auStack_4f0[5] = 0xff;
    auStack_4f0[6] = 0xff;
    auStack_4f0[7] = 0xff;
    iVar3 = secp256k1_ec_seckey_verify(CTX,privkey);
    if (iVar3 == 0) {
      pcVar7 = "test condition failed: secp256k1_ec_seckey_verify(CTX, privkey) == 1";
      uStack_560 = 0x30;
      goto LAB_00120884;
    }
    iVar3 = secp256k1_ec_pubkey_create(CTX,&pubkey,privkey);
    if (iVar3 == 0) {
      pcVar7 = "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1";
      uStack_560 = 0x31;
      goto LAB_00120884;
    }
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&recsig,message,privkey,(secp256k1_nonce_function)0x0,(void *)0x0);
    if (iVar3 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &recsig, message, privkey, NULL, NULL) == 1"
      ;
      uStack_560 = 0x34;
      goto LAB_00120884;
    }
    recpubkey.data._0_8_ = recpubkey.data._0_8_ & 0xffffffff00000000;
    sig._0_8_ = (CTX->illegal_callback).fn;
    sig._8_8_ = (CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&recpubkey);
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (CTX,(secp256k1_ecdsa_recoverable_signature *)0x0,message,privkey,
                       (secp256k1_nonce_function)0x0,(void *)0x0);
    psVar2 = CTX;
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: (secp256k1_ecdsa_sign_recoverable(CTX, ((void*)0), message, privkey, ((void*)0), ((void*)0))) == 0"
      ;
LAB_00120350:
      uStack_560 = 0x35;
      goto LAB_00120884;
    }
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (recpubkey.data._0_4_ != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      goto LAB_00120350;
    }
    recpubkey.data._0_8_ = recpubkey.data._0_8_ & 0xffffffff00000000;
    sig._0_8_ = (psVar2->illegal_callback).fn;
    sig._8_8_ = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&recpubkey);
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&recsig,(uchar *)0x0,privkey,(secp256k1_nonce_function)0x0,(void *)0x0);
    psVar2 = CTX;
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: (secp256k1_ecdsa_sign_recoverable(CTX, &recsig, ((void*)0), privkey, ((void*)0), ((void*)0))) == 0"
      ;
LAB_00120397:
      uStack_560 = 0x36;
      goto LAB_00120884;
    }
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (recpubkey.data._0_4_ != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      goto LAB_00120397;
    }
    recpubkey.data._0_8_ = recpubkey.data._0_8_ & 0xffffffff00000000;
    sig._0_8_ = (psVar2->illegal_callback).fn;
    sig._8_8_ = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&recpubkey);
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&recsig,message,(uchar *)0x0,(secp256k1_nonce_function)0x0,(void *)0x0);
    psVar2 = CTX;
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: (secp256k1_ecdsa_sign_recoverable(CTX, &recsig, message, ((void*)0), ((void*)0), ((void*)0))) == 0"
      ;
LAB_001203de:
      uStack_560 = 0x37;
      goto LAB_00120884;
    }
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (recpubkey.data._0_4_ != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      goto LAB_001203de;
    }
    recpubkey.data._0_8_ = recpubkey.data._0_8_ & 0xffffffff00000000;
    sig._0_8_ = (STATIC_CTX->illegal_callback).fn;
    sig._8_8_ = (STATIC_CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback(STATIC_CTX,counting_callback_fn,&recpubkey);
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (STATIC_CTX,&recsig,message,privkey,(secp256k1_nonce_function)0x0,(void *)0x0)
    ;
    psVar2 = STATIC_CTX;
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: (secp256k1_ecdsa_sign_recoverable(STATIC_CTX, &recsig, message, privkey, ((void*)0), ((void*)0))) == 0"
      ;
LAB_00120425:
      uStack_560 = 0x38;
      goto LAB_00120884;
    }
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (recpubkey.data._0_4_ != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      goto LAB_00120425;
    }
    secp256k1_ecdsa_sign_recoverable
              (CTX,&recsig,message,privkey,recovery_test_nonce_function,(void *)0x0);
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&recsig,message,zero_privkey,(secp256k1_nonce_function)0x0,(void *)0x0);
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &recsig, message, zero_privkey, NULL, NULL) == 0"
      ;
      uStack_560 = 0x3c;
      goto LAB_00120884;
    }
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&recsig,message,(uchar *)&recid_1,(secp256k1_nonce_function)0x0,
                       (void *)0x0);
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &recsig, message, over_privkey, NULL, NULL) == 0"
      ;
      uStack_560 = 0x3d;
      goto LAB_00120884;
    }
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&recsig,message,privkey,(secp256k1_nonce_function)0x0,(void *)0x0);
    if (iVar3 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &recsig, message, privkey, NULL, NULL) == 1"
      ;
      uStack_560 = 0x3f;
      goto LAB_00120884;
    }
    iVar3 = secp256k1_ecdsa_recover(CTX,&recpubkey,&recsig,message);
    if (iVar3 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recover(CTX, &recpubkey, &recsig, message) == 1";
      uStack_560 = 0x44;
      goto LAB_00120884;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (CTX->illegal_callback).fn;
    sig._8_8_ = (CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&_calls_to_callback_4);
    iVar3 = secp256k1_ecdsa_recover(CTX,(secp256k1_pubkey *)0x0,&recsig,message);
    psVar2 = CTX;
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: (secp256k1_ecdsa_recover(CTX, ((void*)0), &recsig, message)) == 0";
LAB_00120504:
      uStack_560 = 0x45;
      goto LAB_00120884;
    }
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      goto LAB_00120504;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (psVar2->illegal_callback).fn;
    sig._8_8_ = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_4);
    iVar3 = secp256k1_ecdsa_recover
                      (CTX,&recpubkey,(secp256k1_ecdsa_recoverable_signature *)0x0,message);
    psVar2 = CTX;
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: (secp256k1_ecdsa_recover(CTX, &recpubkey, ((void*)0), message)) == 0";
LAB_0012054b:
      uStack_560 = 0x46;
      goto LAB_00120884;
    }
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      goto LAB_0012054b;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (psVar2->illegal_callback).fn;
    sig._8_8_ = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_4);
    iVar3 = secp256k1_ecdsa_recover(CTX,&recpubkey,&recsig,(uchar *)0x0);
    psVar2 = CTX;
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: (secp256k1_ecdsa_recover(CTX, &recpubkey, &recsig, ((void*)0))) == 0";
LAB_00120592:
      uStack_560 = 0x47;
      goto LAB_00120884;
    }
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      goto LAB_00120592;
    }
    iVar3 = secp256k1_ecdsa_sign
                      (psVar2,&normal_sig,message,privkey,(secp256k1_nonce_function)0x0,(void *)0x0)
    ;
    if (iVar3 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign(CTX, &normal_sig, message, privkey, NULL, NULL) == 1"
      ;
      uStack_560 = 0x4a;
      goto LAB_00120884;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (CTX->illegal_callback).fn;
    sig._8_8_ = (CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&_calls_to_callback_4);
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x4b;
      goto LAB_00120884;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (psVar2->illegal_callback).fn;
    sig._8_8_ = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_4);
    (*(CTX->illegal_callback).fn)("sigin != NULL",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x4c;
      goto LAB_00120884;
    }
    normal_sig.data[0x10] = recsig.data[0x10];
    normal_sig.data[0x11] = recsig.data[0x11];
    normal_sig.data[0x12] = recsig.data[0x12];
    normal_sig.data[0x13] = recsig.data[0x13];
    normal_sig.data[0x14] = recsig.data[0x14];
    normal_sig.data[0x15] = recsig.data[0x15];
    normal_sig.data[0x16] = recsig.data[0x16];
    normal_sig.data[0x17] = recsig.data[0x17];
    normal_sig.data[0x18] = recsig.data[0x18];
    normal_sig.data[0x19] = recsig.data[0x19];
    normal_sig.data[0x1a] = recsig.data[0x1a];
    normal_sig.data[0x1b] = recsig.data[0x1b];
    normal_sig.data[0x1c] = recsig.data[0x1c];
    normal_sig.data[0x1d] = recsig.data[0x1d];
    normal_sig.data[0x1e] = recsig.data[0x1e];
    normal_sig.data[0x1f] = recsig.data[0x1f];
    normal_sig.data[0] = recsig.data[0];
    normal_sig.data[1] = recsig.data[1];
    normal_sig.data[2] = recsig.data[2];
    normal_sig.data[3] = recsig.data[3];
    normal_sig.data[4] = recsig.data[4];
    normal_sig.data[5] = recsig.data[5];
    normal_sig.data[6] = recsig.data[6];
    normal_sig.data[7] = recsig.data[7];
    normal_sig.data[8] = recsig.data[8];
    normal_sig.data[9] = recsig.data[9];
    normal_sig.data[10] = recsig.data[10];
    normal_sig.data[0xb] = recsig.data[0xb];
    normal_sig.data[0xc] = recsig.data[0xc];
    normal_sig.data[0xd] = recsig.data[0xd];
    normal_sig.data[0xe] = recsig.data[0xe];
    normal_sig.data[0xf] = recsig.data[0xf];
    normal_sig.data[0x30] = recsig.data[0x30];
    normal_sig.data[0x31] = recsig.data[0x31];
    normal_sig.data[0x32] = recsig.data[0x32];
    normal_sig.data[0x33] = recsig.data[0x33];
    normal_sig.data[0x34] = recsig.data[0x34];
    normal_sig.data[0x35] = recsig.data[0x35];
    normal_sig.data[0x36] = recsig.data[0x36];
    normal_sig.data[0x37] = recsig.data[0x37];
    normal_sig.data[0x38] = recsig.data[0x38];
    normal_sig.data[0x39] = recsig.data[0x39];
    normal_sig.data[0x3a] = recsig.data[0x3a];
    normal_sig.data[0x3b] = recsig.data[0x3b];
    normal_sig.data[0x3c] = recsig.data[0x3c];
    normal_sig.data[0x3d] = recsig.data[0x3d];
    normal_sig.data[0x3e] = recsig.data[0x3e];
    normal_sig.data[0x3f] = recsig.data[0x3f];
    normal_sig.data[0x20] = recsig.data[0x20];
    normal_sig.data[0x21] = recsig.data[0x21];
    normal_sig.data[0x22] = recsig.data[0x22];
    normal_sig.data[0x23] = recsig.data[0x23];
    normal_sig.data[0x24] = recsig.data[0x24];
    normal_sig.data[0x25] = recsig.data[0x25];
    normal_sig.data[0x26] = recsig.data[0x26];
    normal_sig.data[0x27] = recsig.data[0x27];
    normal_sig.data[0x28] = recsig.data[0x28];
    normal_sig.data[0x29] = recsig.data[0x29];
    normal_sig.data[0x2a] = recsig.data[0x2a];
    normal_sig.data[0x2b] = recsig.data[0x2b];
    normal_sig.data[0x2c] = recsig.data[0x2c];
    normal_sig.data[0x2d] = recsig.data[0x2d];
    normal_sig.data[0x2e] = recsig.data[0x2e];
    normal_sig.data[0x2f] = recsig.data[0x2f];
    iVar3 = secp256k1_ecdsa_sign_recoverable
                      (psVar2,&recsig,message,privkey,(secp256k1_nonce_function)0x0,(void *)0x0);
    if (iVar3 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &recsig, message, privkey, NULL, NULL) == 1"
      ;
      uStack_560 = 0x50;
      goto LAB_00120884;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (CTX->illegal_callback).fn;
    sig._8_8_ = (CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&_calls_to_callback_4);
    (*(CTX->illegal_callback).fn)("output64 != NULL",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x51;
      goto LAB_00120884;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (psVar2->illegal_callback).fn;
    sig._8_8_ = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_4);
    (*(CTX->illegal_callback).fn)("recid != NULL",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x52;
      goto LAB_00120884;
    }
    __calls_to_callback_4 =
         (_func_void_char_ptr_void_ptr *)((ulong)__calls_to_callback_4 & 0xffffffff00000000);
    sig._0_8_ = (psVar2->illegal_callback).fn;
    sig._8_8_ = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_4);
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)sig._0_8_;
    (psVar2->illegal_callback).data = (void *)sig._8_8_;
    if (_calls_to_callback_4 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x53;
      goto LAB_00120884;
    }
    iVar3 = secp256k1_ecdsa_recoverable_signature_serialize_compact(psVar2,sig,&recid,&recsig);
    if (iVar3 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recoverable_signature_serialize_compact(CTX, sig, &recid, &recsig) == 1"
      ;
      uStack_560 = 0x54;
      goto LAB_00120884;
    }
    __calls_to_callback_12 = __calls_to_callback_12 & 0xffffffff00000000;
    __calls_to_callback_4 = (CTX->illegal_callback).fn;
    pvStack_540 = (CTX->illegal_callback).data;
    secp256k1_context_set_illegal_callback(CTX,counting_callback_fn,&_calls_to_callback_12);
    (*(CTX->illegal_callback).fn)("sig != NULL",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = __calls_to_callback_4;
    (psVar2->illegal_callback).data = pvStack_540;
    if (_calls_to_callback_12 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x56;
      goto LAB_00120884;
    }
    __calls_to_callback_12 = __calls_to_callback_12 & 0xffffffff00000000;
    __calls_to_callback_4 = (psVar2->illegal_callback).fn;
    pvStack_540 = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_12);
    (*(CTX->illegal_callback).fn)("input64 != NULL",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = __calls_to_callback_4;
    (psVar2->illegal_callback).data = pvStack_540;
    if (_calls_to_callback_12 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x57;
      goto LAB_00120884;
    }
    __calls_to_callback_12 = __calls_to_callback_12 & 0xffffffff00000000;
    __calls_to_callback_4 = (psVar2->illegal_callback).fn;
    pvStack_540 = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_12);
    (*(CTX->illegal_callback).fn)("recid >= 0 && recid <= 3",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = __calls_to_callback_4;
    (psVar2->illegal_callback).data = pvStack_540;
    if (_calls_to_callback_12 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x58;
      goto LAB_00120884;
    }
    __calls_to_callback_12 = __calls_to_callback_12 & 0xffffffff00000000;
    __calls_to_callback_4 = (psVar2->illegal_callback).fn;
    pvStack_540 = (psVar2->illegal_callback).data;
    secp256k1_context_set_illegal_callback(psVar2,counting_callback_fn,&_calls_to_callback_12);
    (*(CTX->illegal_callback).fn)("recid >= 0 && recid <= 3",(CTX->illegal_callback).data);
    psVar2 = CTX;
    (CTX->illegal_callback).fn = __calls_to_callback_4;
    (psVar2->illegal_callback).data = pvStack_540;
    if (_calls_to_callback_12 != 1) {
      pcVar7 = "test condition failed: _calls_to_callback == 1";
      uStack_560 = 0x59;
      goto LAB_00120884;
    }
    sig[0] = (undefined1)recid_1;
    sig[1] = recid_1._1_1_;
    sig[2] = recid_1._2_1_;
    sig[3] = recid_1._3_1_;
    sig[4] = uStack_4f4;
    sig[5] = uStack_4f3;
    sig[6] = uStack_4f2;
    sig[7] = uStack_4f1;
    sig[8] = auStack_4f0[0];
    sig[9] = auStack_4f0[1];
    sig[10] = auStack_4f0[2];
    sig[0xb] = auStack_4f0[3];
    sig[0xc] = auStack_4f0[4];
    sig[0xd] = auStack_4f0[5];
    sig[0xe] = auStack_4f0[6];
    sig[0xf] = auStack_4f0[7];
    sig[0x10] = auStack_4f0[8];
    sig[0x11] = auStack_4f0[9];
    sig[0x12] = auStack_4f0[10];
    sig[0x13] = auStack_4f0[0xb];
    sig[0x14] = auStack_4f0[0xc];
    sig[0x15] = auStack_4f0[0xd];
    sig[0x16] = auStack_4f0[0xe];
    sig[0x17] = auStack_4f0[0xf];
    sig[0x18] = auStack_4f0[0x10];
    sig[0x19] = auStack_4f0[0x11];
    sig[0x1a] = auStack_4f0[0x12];
    sig[0x1b] = auStack_4f0[0x13];
    sig[0x1c] = auStack_4f0[0x14];
    sig[0x1d] = auStack_4f0[0x15];
    sig[0x1e] = auStack_4f0[0x16];
    sig[0x1f] = auStack_4f0[0x17];
    iVar3 = secp256k1_ecdsa_recoverable_signature_parse_compact(psVar2,&recsig,sig,recid);
    if (iVar3 != 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &recsig, sig, recid) == 0"
      ;
      uStack_560 = 0x5c;
      goto LAB_00120884;
    }
    iVar6 = iVar6 + 1;
  }
  uVar9 = 0;
  while ((int)uVar9 < COUNT * 0x40) {
    privkey[0x10] = '\0';
    privkey[0x11] = '\0';
    privkey[0x12] = '\0';
    privkey[0x13] = '\0';
    privkey[0x14] = '\0';
    privkey[0x15] = '\0';
    privkey[0x16] = '\0';
    privkey[0x17] = '\0';
    privkey[0x18] = '\0';
    privkey[0x19] = '\0';
    privkey[0x1a] = '\0';
    privkey[0x1b] = '\0';
    privkey[0x1c] = '\0';
    privkey[0x1d] = '\0';
    privkey[0x1e] = '\0';
    privkey[0x1f] = '\0';
    privkey[0] = '\0';
    privkey[1] = '\0';
    privkey[2] = '\0';
    privkey[3] = '\0';
    privkey[4] = '\0';
    privkey[5] = '\0';
    privkey[6] = '\0';
    privkey[7] = '\0';
    privkey[8] = '\0';
    privkey[9] = '\0';
    privkey[10] = '\0';
    privkey[0xb] = '\0';
    privkey[0xc] = '\0';
    privkey[0xd] = '\0';
    privkey[0xe] = '\0';
    privkey[0xf] = '\0';
    _recid_1 = _recid_1 & 0xffffffff00000000;
    testutil_random_scalar_order_test((secp256k1_scalar *)&pubkey);
    testutil_random_scalar_order_test((secp256k1_scalar *)&recpubkey);
    secp256k1_scalar_get_b32(message,(secp256k1_scalar *)&recpubkey);
    secp256k1_scalar_get_b32(zero_privkey,(secp256k1_scalar *)&pubkey);
    iVar6 = secp256k1_ec_seckey_verify(CTX,message);
    if (iVar6 == 0) {
      pcVar7 = "test condition failed: secp256k1_ec_seckey_verify(CTX, privkey) == 1";
      uStack_560 = 0x74;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ec_pubkey_create(CTX,&recpubkey,message);
    if (iVar6 == 0) {
      pcVar7 = "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1";
      uStack_560 = 0x75;
      goto LAB_00120884;
    }
    privkey._0_8_ = privkey._0_8_ & 0xffffffffffffff00;
    iVar6 = secp256k1_ecdsa_sign_recoverable
                      (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,zero_privkey,message,
                       (secp256k1_nonce_function)0x0,(void *)0x0);
    if (iVar6 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[0], message, privkey, NULL, NULL) == 1"
      ;
      uStack_560 = 0x79;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_sign
                      (CTX,(secp256k1_ecdsa_signature *)&recsig,zero_privkey,message,
                       (secp256k1_nonce_function)0x0,(void *)0x0);
    if (iVar6 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[0], message, privkey, NULL, NULL) == 1"
      ;
      uStack_560 = 0x7a;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&local_214,zero_privkey,message,(secp256k1_nonce_function)0x0,(void *)0x0
                      );
    if (iVar6 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[4], message, privkey, NULL, NULL) == 1"
      ;
      uStack_560 = 0x7b;
      goto LAB_00120884;
    }
    local_4d0 = uVar9;
    iVar6 = secp256k1_ecdsa_sign_recoverable
                      (CTX,(secp256k1_ecdsa_recoverable_signature *)(sig + 0x41),zero_privkey,
                       message,(secp256k1_nonce_function)0x0,privkey);
    if (iVar6 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[1], message, privkey, NULL, extra) == 1"
      ;
      uStack_560 = 0x7c;
      goto LAB_00120884;
    }
    privkey[0x1f] = '\x01';
    iVar6 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&local_296,zero_privkey,message,(secp256k1_nonce_function)0x0,privkey);
    if (iVar6 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[2], message, privkey, NULL, extra) == 1"
      ;
      uStack_560 = 0x7e;
      goto LAB_00120884;
    }
    privkey._24_8_ = privkey._24_8_ & 0xffffffffffffff;
    privkey[0] = '\x01';
    iVar6 = secp256k1_ecdsa_sign_recoverable
                      (CTX,&local_255,zero_privkey,message,(secp256k1_nonce_function)0x0,privkey);
    if (iVar6 != 1) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_sign_recoverable(CTX, &rsignature[3], message, privkey, NULL, extra) == 1"
      ;
      uStack_560 = 0x81;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_recoverable_signature_serialize_compact
                      (CTX,pubkey.data,&recid_1,&local_214);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recoverable_signature_serialize_compact(CTX, sig, &recid, &rsignature[4]) == 1"
      ;
      uStack_560 = 0x82;
      goto LAB_00120884;
    }
    local_78.data[0x30] = local_214.data[0x30];
    local_78.data[0x31] = local_214.data[0x31];
    local_78.data[0x32] = local_214.data[0x32];
    local_78.data[0x33] = local_214.data[0x33];
    local_78.data[0x34] = local_214.data[0x34];
    local_78.data[0x35] = local_214.data[0x35];
    local_78.data[0x36] = local_214.data[0x36];
    local_78.data[0x37] = local_214.data[0x37];
    local_78.data[0x38] = local_214.data[0x38];
    local_78.data[0x39] = local_214.data[0x39];
    local_78.data[0x3a] = local_214.data[0x3a];
    local_78.data[0x3b] = local_214.data[0x3b];
    local_78.data[0x3c] = local_214.data[0x3c];
    local_78.data[0x3d] = local_214.data[0x3d];
    local_78.data[0x3e] = local_214.data[0x3e];
    local_78.data[0x3f] = local_214.data[0x3f];
    local_78.data[0x20] = local_214.data[0x20];
    local_78.data[0x21] = local_214.data[0x21];
    local_78.data[0x22] = local_214.data[0x22];
    local_78.data[0x23] = local_214.data[0x23];
    local_78.data[0x24] = local_214.data[0x24];
    local_78.data[0x25] = local_214.data[0x25];
    local_78.data[0x26] = local_214.data[0x26];
    local_78.data[0x27] = local_214.data[0x27];
    local_78.data[0x28] = local_214.data[0x28];
    local_78.data[0x29] = local_214.data[0x29];
    local_78.data[0x2a] = local_214.data[0x2a];
    local_78.data[0x2b] = local_214.data[0x2b];
    local_78.data[0x2c] = local_214.data[0x2c];
    local_78.data[0x2d] = local_214.data[0x2d];
    local_78.data[0x2e] = local_214.data[0x2e];
    local_78.data[0x2f] = local_214.data[0x2f];
    local_78.data[0x10] = local_214.data[0x10];
    local_78.data[0x11] = local_214.data[0x11];
    local_78.data[0x12] = local_214.data[0x12];
    local_78.data[0x13] = local_214.data[0x13];
    local_78.data[0x14] = local_214.data[0x14];
    local_78.data[0x15] = local_214.data[0x15];
    local_78.data[0x16] = local_214.data[0x16];
    local_78.data[0x17] = local_214.data[0x17];
    local_78.data[0x18] = local_214.data[0x18];
    local_78.data[0x19] = local_214.data[0x19];
    local_78.data[0x1a] = local_214.data[0x1a];
    local_78.data[0x1b] = local_214.data[0x1b];
    local_78.data[0x1c] = local_214.data[0x1c];
    local_78.data[0x1d] = local_214.data[0x1d];
    local_78.data[0x1e] = local_214.data[0x1e];
    local_78.data[0x1f] = local_214.data[0x1f];
    local_78.data[0] = local_214.data[0];
    local_78.data[1] = local_214.data[1];
    local_78.data[2] = local_214.data[2];
    local_78.data[3] = local_214.data[3];
    local_78.data[4] = local_214.data[4];
    local_78.data[5] = local_214.data[5];
    local_78.data[6] = local_214.data[6];
    local_78.data[7] = local_214.data[7];
    local_78.data[8] = local_214.data[8];
    local_78.data[9] = local_214.data[9];
    local_78.data[10] = local_214.data[10];
    local_78.data[0xb] = local_214.data[0xb];
    local_78.data[0xc] = local_214.data[0xc];
    local_78.data[0xd] = local_214.data[0xd];
    local_78.data[0xe] = local_214.data[0xe];
    local_78.data[0xf] = local_214.data[0xf];
    iVar6 = secp256k1_memcmp_var(&local_78,&recsig,0x40);
    if (iVar6 != 0) {
      pcVar7 = "test condition failed: secp256k1_memcmp_var(&signature[4], &signature[0], 64) == 0";
      uStack_560 = 0x84;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_verify(CTX,&local_78,zero_privkey,&recpubkey);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 1";
      uStack_560 = 0x85;
      goto LAB_00120884;
    }
    local_214.data[0x30] = '\0';
    local_214.data[0x31] = '\0';
    local_214.data[0x32] = '\0';
    local_214.data[0x33] = '\0';
    local_214.data[0x34] = '\0';
    local_214.data[0x35] = '\0';
    local_214.data[0x36] = '\0';
    local_214.data[0x37] = '\0';
    local_214.data[0x38] = '\0';
    local_214.data[0x39] = '\0';
    local_214.data[0x3a] = '\0';
    local_214.data[0x3b] = '\0';
    local_214.data[0x3c] = '\0';
    local_214.data[0x3d] = '\0';
    local_214.data[0x3e] = '\0';
    local_214.data[0x3f] = '\0';
    local_214.data[0x20] = '\0';
    local_214.data[0x21] = '\0';
    local_214.data[0x22] = '\0';
    local_214.data[0x23] = '\0';
    local_214.data[0x24] = '\0';
    local_214.data[0x25] = '\0';
    local_214.data[0x26] = '\0';
    local_214.data[0x27] = '\0';
    local_214.data[0x28] = '\0';
    local_214.data[0x29] = '\0';
    local_214.data[0x2a] = '\0';
    local_214.data[0x2b] = '\0';
    local_214.data[0x2c] = '\0';
    local_214.data[0x2d] = '\0';
    local_214.data[0x2e] = '\0';
    local_214.data[0x2f] = '\0';
    local_214.data[0x10] = '\0';
    local_214.data[0x11] = '\0';
    local_214.data[0x12] = '\0';
    local_214.data[0x13] = '\0';
    local_214.data[0x14] = '\0';
    local_214.data[0x15] = '\0';
    local_214.data[0x16] = '\0';
    local_214.data[0x17] = '\0';
    local_214.data[0x18] = '\0';
    local_214.data[0x19] = '\0';
    local_214.data[0x1a] = '\0';
    local_214.data[0x1b] = '\0';
    local_214.data[0x1c] = '\0';
    local_214.data[0x1d] = '\0';
    local_214.data[0x1e] = '\0';
    local_214.data[0x1f] = '\0';
    local_214.data[0] = '\0';
    local_214.data[1] = '\0';
    local_214.data[2] = '\0';
    local_214.data[3] = '\0';
    local_214.data[4] = '\0';
    local_214.data[5] = '\0';
    local_214.data[6] = '\0';
    local_214.data[7] = '\0';
    local_214.data[8] = '\0';
    local_214.data[9] = '\0';
    local_214.data[10] = '\0';
    local_214.data[0xb] = '\0';
    local_214.data[0xc] = '\0';
    local_214.data[0xd] = '\0';
    local_214.data[0xe] = '\0';
    local_214.data[0xf] = '\0';
    local_214.data[0x40] = '\0';
    iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact(CTX,&local_214,pubkey.data,recid_1);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1"
      ;
      uStack_560 = 0x87;
      goto LAB_00120884;
    }
    local_78.data[0x30] = local_214.data[0x30];
    local_78.data[0x31] = local_214.data[0x31];
    local_78.data[0x32] = local_214.data[0x32];
    local_78.data[0x33] = local_214.data[0x33];
    local_78.data[0x34] = local_214.data[0x34];
    local_78.data[0x35] = local_214.data[0x35];
    local_78.data[0x36] = local_214.data[0x36];
    local_78.data[0x37] = local_214.data[0x37];
    local_78.data[0x38] = local_214.data[0x38];
    local_78.data[0x39] = local_214.data[0x39];
    local_78.data[0x3a] = local_214.data[0x3a];
    local_78.data[0x3b] = local_214.data[0x3b];
    local_78.data[0x3c] = local_214.data[0x3c];
    local_78.data[0x3d] = local_214.data[0x3d];
    local_78.data[0x3e] = local_214.data[0x3e];
    local_78.data[0x3f] = local_214.data[0x3f];
    local_78.data[0x20] = local_214.data[0x20];
    local_78.data[0x21] = local_214.data[0x21];
    local_78.data[0x22] = local_214.data[0x22];
    local_78.data[0x23] = local_214.data[0x23];
    local_78.data[0x24] = local_214.data[0x24];
    local_78.data[0x25] = local_214.data[0x25];
    local_78.data[0x26] = local_214.data[0x26];
    local_78.data[0x27] = local_214.data[0x27];
    local_78.data[0x28] = local_214.data[0x28];
    local_78.data[0x29] = local_214.data[0x29];
    local_78.data[0x2a] = local_214.data[0x2a];
    local_78.data[0x2b] = local_214.data[0x2b];
    local_78.data[0x2c] = local_214.data[0x2c];
    local_78.data[0x2d] = local_214.data[0x2d];
    local_78.data[0x2e] = local_214.data[0x2e];
    local_78.data[0x2f] = local_214.data[0x2f];
    local_78.data[0x10] = local_214.data[0x10];
    local_78.data[0x11] = local_214.data[0x11];
    local_78.data[0x12] = local_214.data[0x12];
    local_78.data[0x13] = local_214.data[0x13];
    local_78.data[0x14] = local_214.data[0x14];
    local_78.data[0x15] = local_214.data[0x15];
    local_78.data[0x16] = local_214.data[0x16];
    local_78.data[0x17] = local_214.data[0x17];
    local_78.data[0x18] = local_214.data[0x18];
    local_78.data[0x19] = local_214.data[0x19];
    local_78.data[0x1a] = local_214.data[0x1a];
    local_78.data[0x1b] = local_214.data[0x1b];
    local_78.data[0x1c] = local_214.data[0x1c];
    local_78.data[0x1d] = local_214.data[0x1d];
    local_78.data[0x1e] = local_214.data[0x1e];
    local_78.data[0x1f] = local_214.data[0x1f];
    local_78.data[0] = local_214.data[0];
    local_78.data[1] = local_214.data[1];
    local_78.data[2] = local_214.data[2];
    local_78.data[3] = local_214.data[3];
    local_78.data[4] = local_214.data[4];
    local_78.data[5] = local_214.data[5];
    local_78.data[6] = local_214.data[6];
    local_78.data[7] = local_214.data[7];
    local_78.data[8] = local_214.data[8];
    local_78.data[9] = local_214.data[9];
    local_78.data[10] = local_214.data[10];
    local_78.data[0xb] = local_214.data[0xb];
    local_78.data[0xc] = local_214.data[0xc];
    local_78.data[0xd] = local_214.data[0xd];
    local_78.data[0xe] = local_214.data[0xe];
    local_78.data[0xf] = local_214.data[0xf];
    iVar6 = secp256k1_ecdsa_verify(CTX,&local_78,zero_privkey,&recpubkey);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 1";
      uStack_560 = 0x89;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact(CTX,&local_214,pubkey.data,recid_1);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1"
      ;
      uStack_560 = 0x8b;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_recover(CTX,(secp256k1_pubkey *)&normal_sig,&local_214,zero_privkey);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recover(CTX, &recpubkey, &rsignature[4], message) == 1"
      ;
      uStack_560 = 0x8c;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_memcmp_var(&recpubkey,(secp256k1_pubkey *)&normal_sig,0x40);
    if (iVar6 != 0) {
      pcVar7 = 
      "test condition failed: secp256k1_memcmp_var(&pubkey, &recpubkey, sizeof(pubkey)) == 0";
      uStack_560 = 0x8d;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_recoverable_signature_serialize_compact
                      (CTX,pubkey.data,&recid_1,&local_214);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recoverable_signature_serialize_compact(CTX, sig, &recid, &rsignature[4]) == 1"
      ;
      uStack_560 = 0x8f;
      goto LAB_00120884;
    }
    uVar4 = testrand_int(0xff);
    uVar5 = testrand64();
    pubkey.data[uVar5 >> 0x3a] = (char)uVar4 + pubkey.data[uVar5 >> 0x3a] + '\x01';
    iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact(CTX,&local_214,pubkey.data,recid_1);
    if (iVar6 == 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsignature[4], sig, recid) == 1"
      ;
      uStack_560 = 0x91;
      goto LAB_00120884;
    }
    local_78.data[0x30] = local_214.data[0x30];
    local_78.data[0x31] = local_214.data[0x31];
    local_78.data[0x32] = local_214.data[0x32];
    local_78.data[0x33] = local_214.data[0x33];
    local_78.data[0x34] = local_214.data[0x34];
    local_78.data[0x35] = local_214.data[0x35];
    local_78.data[0x36] = local_214.data[0x36];
    local_78.data[0x37] = local_214.data[0x37];
    local_78.data[0x38] = local_214.data[0x38];
    local_78.data[0x39] = local_214.data[0x39];
    local_78.data[0x3a] = local_214.data[0x3a];
    local_78.data[0x3b] = local_214.data[0x3b];
    local_78.data[0x3c] = local_214.data[0x3c];
    local_78.data[0x3d] = local_214.data[0x3d];
    local_78.data[0x3e] = local_214.data[0x3e];
    local_78.data[0x3f] = local_214.data[0x3f];
    local_78.data[0x20] = local_214.data[0x20];
    local_78.data[0x21] = local_214.data[0x21];
    local_78.data[0x22] = local_214.data[0x22];
    local_78.data[0x23] = local_214.data[0x23];
    local_78.data[0x24] = local_214.data[0x24];
    local_78.data[0x25] = local_214.data[0x25];
    local_78.data[0x26] = local_214.data[0x26];
    local_78.data[0x27] = local_214.data[0x27];
    local_78.data[0x28] = local_214.data[0x28];
    local_78.data[0x29] = local_214.data[0x29];
    local_78.data[0x2a] = local_214.data[0x2a];
    local_78.data[0x2b] = local_214.data[0x2b];
    local_78.data[0x2c] = local_214.data[0x2c];
    local_78.data[0x2d] = local_214.data[0x2d];
    local_78.data[0x2e] = local_214.data[0x2e];
    local_78.data[0x2f] = local_214.data[0x2f];
    local_78.data[0x10] = local_214.data[0x10];
    local_78.data[0x11] = local_214.data[0x11];
    local_78.data[0x12] = local_214.data[0x12];
    local_78.data[0x13] = local_214.data[0x13];
    local_78.data[0x14] = local_214.data[0x14];
    local_78.data[0x15] = local_214.data[0x15];
    local_78.data[0x16] = local_214.data[0x16];
    local_78.data[0x17] = local_214.data[0x17];
    local_78.data[0x18] = local_214.data[0x18];
    local_78.data[0x19] = local_214.data[0x19];
    local_78.data[0x1a] = local_214.data[0x1a];
    local_78.data[0x1b] = local_214.data[0x1b];
    local_78.data[0x1c] = local_214.data[0x1c];
    local_78.data[0x1d] = local_214.data[0x1d];
    local_78.data[0x1e] = local_214.data[0x1e];
    local_78.data[0x1f] = local_214.data[0x1f];
    local_78.data[0] = local_214.data[0];
    local_78.data[1] = local_214.data[1];
    local_78.data[2] = local_214.data[2];
    local_78.data[3] = local_214.data[3];
    local_78.data[4] = local_214.data[4];
    local_78.data[5] = local_214.data[5];
    local_78.data[6] = local_214.data[6];
    local_78.data[7] = local_214.data[7];
    local_78.data[8] = local_214.data[8];
    local_78.data[9] = local_214.data[9];
    local_78.data[10] = local_214.data[10];
    local_78.data[0xb] = local_214.data[0xb];
    local_78.data[0xc] = local_214.data[0xc];
    local_78.data[0xd] = local_214.data[0xd];
    local_78.data[0xe] = local_214.data[0xe];
    local_78.data[0xf] = local_214.data[0xf];
    iVar6 = secp256k1_ecdsa_verify(CTX,&local_78,zero_privkey,&recpubkey);
    if (iVar6 != 0) {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[4], message, &pubkey) == 0";
      uStack_560 = 0x93;
      goto LAB_00120884;
    }
    iVar6 = secp256k1_ecdsa_recover(CTX,(secp256k1_pubkey *)&normal_sig,&local_214,zero_privkey);
    if ((iVar6 != 0) &&
       (iVar6 = secp256k1_memcmp_var(&recpubkey,(secp256k1_pubkey *)&normal_sig,0x40), iVar6 == 0))
    {
      pcVar7 = 
      "test condition failed: secp256k1_ecdsa_recover(CTX, &recpubkey, &rsignature[4], message) == 0 || secp256k1_memcmp_var(&pubkey, &recpubkey, sizeof(pubkey)) != 0"
      ;
      uStack_560 = 0x96;
      goto LAB_00120884;
    }
    uVar9 = (ulong)((int)local_4d0 + 1);
  }
  builtin_memcpy(msg32 + 0x10,"ecret message...",0x10);
  builtin_memcpy(msg32,"This is a very s",0x10);
  recsig.data[0x30] = '}';
  recsig.data[0x31] = 0xd7;
  recsig.data[0x32] = '>';
  recsig.data[0x33] = '8';
  recsig.data[0x34] = '~';
  recsig.data[0x35] = 0xe4;
  recsig.data[0x36] = 0xfc;
  recsig.data[0x37] = 0x86;
  recsig.data[0x38] = 'n';
  recsig.data[0x39] = '\x1b';
  recsig.data[0x3a] = 0xe8;
  recsig.data[0x3b] = 0xec;
  recsig.data[0x3c] = 199;
  recsig.data[0x3d] = 0xdd;
  recsig.data[0x3e] = 0x95;
  recsig.data[0x3f] = 'W';
  recsig.data[0x20] = 'K';
  recsig.data[0x21] = '\x1b';
  recsig.data[0x22] = '}';
  recsig.data[0x23] = 0xf3;
  recsig.data[0x24] = 'L';
  recsig.data[0x25] = 0xe1;
  recsig.data[0x26] = 0xf6;
  recsig.data[0x27] = 0x8e;
  recsig.data[0x28] = 'i';
  recsig.data[0x29] = 'O';
  recsig.data[0x2a] = 0xf6;
  recsig.data[0x2b] = 0xf1;
  recsig.data[0x2c] = '\x1a';
  recsig.data[0x2d] = 199;
  recsig.data[0x2e] = 'Q';
  recsig.data[0x2f] = 0xdd;
  recsig.data[0x10] = 'b';
  recsig.data[0x11] = 0xfd;
  recsig.data[0x12] = 0xe4;
  recsig.data[0x13] = 'F';
  recsig.data[0x14] = 'I';
  recsig.data[0x15] = 0x99;
  recsig.data[0x16] = 'Y';
  recsig.data[0x17] = 'c';
  recsig.data[0x18] = '\x17';
  recsig.data[0x19] = 0x9a;
  recsig.data[0x1a] = '}';
  recsig.data[0x1b] = 0xd1;
  recsig.data[0x1c] = '{';
  recsig.data[0x1d] = 0xd2;
  recsig.data[0x1e] = '5';
  recsig.data[0x1f] = '2';
  recsig.data[0] = 'g';
  recsig.data[1] = 0xcb;
  recsig.data[2] = '(';
  recsig.data[3] = '_';
  recsig.data[4] = 0x9c;
  recsig.data[5] = 0xd1;
  recsig.data[6] = 0x94;
  recsig.data[7] = 0xe8;
  recsig.data[8] = '@';
  recsig.data[9] = 0xd6;
  recsig.data[10] = ')';
  recsig.data[0xb] = '9';
  recsig.data[0xc] = 'z';
  recsig.data[0xd] = 0xf5;
  recsig.data[0xe] = 'V';
  recsig.data[0xf] = 0x96;
  recpubkey.data[0x10] = '\0';
  recpubkey.data[0x11] = '\0';
  recpubkey.data[0x12] = '\0';
  recpubkey.data[0x13] = '\0';
  recpubkey.data[0x14] = '\0';
  recpubkey.data[0x15] = '\0';
  recpubkey.data[0x16] = '\0';
  recpubkey.data[0x17] = '\0';
  recpubkey.data[0x30] = '\0';
  recpubkey.data[0x31] = '\0';
  recpubkey.data[0x32] = '\0';
  recpubkey.data[0x33] = '\0';
  recpubkey.data[0x34] = '\0';
  recpubkey.data[0x35] = '\0';
  recpubkey.data[0x36] = '\0';
  recpubkey.data[0x37] = '\0';
  recpubkey.data[0x20] = '\0';
  recpubkey.data[0x21] = '\0';
  recpubkey.data[0x22] = '\0';
  recpubkey.data[0x23] = '\0';
  recpubkey.data[0x24] = '\0';
  recpubkey.data[0x25] = '\0';
  recpubkey.data[0x26] = '\0';
  recpubkey.data[0x27] = '\0';
  recpubkey.data[0x28] = '\0';
  recpubkey.data[0x29] = '\0';
  recpubkey.data[0x2a] = '\0';
  recpubkey.data[0x2b] = '\0';
  recpubkey.data[0x2c] = '\0';
  recpubkey.data[0x2d] = '\0';
  recpubkey.data[0x2e] = '\0';
  recpubkey.data[0x2f] = '\0';
  recpubkey.data[0] = '\0';
  recpubkey.data[1] = '\0';
  recpubkey.data[2] = '\0';
  recpubkey.data[3] = '\0';
  recpubkey.data[4] = '\0';
  recpubkey.data[5] = '\0';
  recpubkey.data[6] = '\0';
  recpubkey.data[7] = '\0';
  recpubkey.data[8] = '\0';
  recpubkey.data[9] = '\0';
  recpubkey.data[10] = '\0';
  recpubkey.data[0xb] = '\0';
  recpubkey.data[0xc] = '\0';
  recpubkey.data[0xd] = '\0';
  recpubkey.data[0xe] = '\0';
  recpubkey.data[0xf] = '\0';
  recpubkey.data[0x18] = '\0';
  recpubkey.data[0x19] = '\0';
  recpubkey.data[0x1a] = '\0';
  recpubkey.data[0x1b] = '\0';
  recpubkey.data[0x1c] = '\0';
  recpubkey.data[0x1d] = '\0';
  recpubkey.data[0x1e] = '\0';
  recpubkey.data[0x1f] = '\x04';
  recpubkey.data[0x38] = '\0';
  recpubkey.data[0x39] = '\0';
  recpubkey.data[0x3a] = '\0';
  recpubkey.data[0x3b] = '\0';
  recpubkey.data[0x3c] = '\0';
  recpubkey.data[0x3d] = '\0';
  recpubkey.data[0x3e] = '\0';
  recpubkey.data[0x3f] = '\x04';
  iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                    (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,recsig.data,0);
  if (iVar6 == 0) {
    pcVar7 = 
    "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 0)"
    ;
    uStack_560 = 0xbe;
  }
  else {
    iVar6 = secp256k1_ecdsa_recover(CTX,&pubkey,(secp256k1_ecdsa_recoverable_signature *)sig,msg32);
    if (iVar6 == 0) {
      iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                        (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,recsig.data,1);
      if (iVar6 == 0) {
        pcVar7 = 
        "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 1)"
        ;
        uStack_560 = 0xc0;
      }
      else {
        iVar6 = secp256k1_ecdsa_recover
                          (CTX,&pubkey,(secp256k1_ecdsa_recoverable_signature *)sig,msg32);
        if (iVar6 == 0) {
          pcVar7 = "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)";
          uStack_560 = 0xc1;
        }
        else {
          iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                            (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,recsig.data,2);
          if (iVar6 == 0) {
            pcVar7 = 
            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 2)"
            ;
            uStack_560 = 0xc2;
          }
          else {
            iVar6 = secp256k1_ecdsa_recover
                              (CTX,&pubkey,(secp256k1_ecdsa_recoverable_signature *)sig,msg32);
            if (iVar6 == 0) {
              iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                                (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,recsig.data,3);
              if (iVar6 == 0) {
                pcVar7 = 
                "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sig64, 3)"
                ;
                uStack_560 = 0xc4;
              }
              else {
                iVar6 = secp256k1_ecdsa_recover
                                  (CTX,&pubkey,(secp256k1_ecdsa_recoverable_signature *)sig,msg32);
                if (iVar6 == 0) {
                  uVar9 = 0;
                  while ((int)uVar9 != 4) {
                    builtin_memcpy(sigbder,"0\x06\x02\x01\x04\x02\x01\x04",8);
                    sigcder_zr[4] = '\x02';
                    sigcder_zr[5] = '\x01';
                    sigcder_zr[6] = '\x01';
                    builtin_memcpy(sigcder_zr,"0\x05\x02",4);
                    builtin_memcpy(sigcder_zs,"0\x05\x02\x01\x01\x02",7);
                    local_378 = 0;
                    uStack_370 = 0;
                    _recid = 0x20022530;
                    uStack_380 = 0;
                    uStack_369 = 0;
                    uStack_368 = 0x4010204000000;
                    local_468 = 0;
                    uStack_460 = 0;
                    __calls_to_callback_12 = 0x20020401022530;
                    uStack_470 = 0;
                    uStack_459 = 0;
                    uStack_458 = 0x4000000000000;
                    zero_privkey._16_16_ = ZEXT816(0);
                    zero_privkey._0_16_ = ZEXT816(0x21022630);
                    auStack_4f0[0x18] = '\0';
                    auStack_4f0[0x19] = '\0';
                    auStack_4f0[0x1a] = '\0';
                    auStack_4f0[0x1b] = '\0';
                    auStack_4f0[0x1c] = '\0';
                    auStack_4f0[0x1d] = '\0';
                    auStack_4f0[0x1e] = '\0';
                    auStack_4f0[0x1f] = '\x04';
                    auStack_4f0[8] = '\0';
                    auStack_4f0[9] = '\0';
                    auStack_4f0[10] = '\0';
                    auStack_4f0[0xb] = '\0';
                    auStack_4f0[0xc] = '\0';
                    auStack_4f0[0xd] = '\0';
                    auStack_4f0[0xe] = '\0';
                    auStack_4f0[0xf] = '\0';
                    auStack_4f0[0x10] = '\0';
                    auStack_4f0[0x11] = '\0';
                    auStack_4f0[0x12] = '\0';
                    auStack_4f0[0x13] = '\0';
                    auStack_4f0[0x14] = '\0';
                    auStack_4f0[0x15] = '\0';
                    auStack_4f0[0x16] = '\0';
                    auStack_4f0[0x17] = '\0';
                    _recid_1 = 0x21020401022630;
                    auStack_4f0[0] = '\0';
                    auStack_4f0[1] = '\0';
                    auStack_4f0[2] = '\0';
                    auStack_4f0[3] = '\0';
                    auStack_4f0[4] = '\0';
                    auStack_4f0[5] = '\0';
                    auStack_4f0[6] = '\0';
                    auStack_4f0[7] = '\0';
                    local_528 = 0x40102454136d08c;
                    local_538 = 0xdcaebafeffffffff;
                    uStack_530 = 0x5ed2bf3ba048afe6;
                    __calls_to_callback_4 = (_func_void_char_ptr_void_ptr *)0xffffff0021022630;
                    pvStack_540 = (void *)0xffffffffffffffff;
                    iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                                      (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,
                                       recpubkey.data,(int)uVar9);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigb64, recid) == 1"
                      ;
                      uStack_560 = 0xf2;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_recover
                                      (CTX,(secp256k1_pubkey *)&normal_sig,
                                       (secp256k1_ecdsa_recoverable_signature *)sig,msg32);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 1"
                      ;
                      uStack_560 = 0xf3;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,sigbder,8);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 1"
                      ;
                      uStack_560 = 0xf4;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_verify
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                       (secp256k1_pubkey *)&normal_sig);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 1"
                      ;
                      uStack_560 = 0xf5;
                      goto LAB_00120884;
                    }
                    local_4d0 = uVar9;
                    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
                      iVar3 = secp256k1_ecdsa_recoverable_signature_parse_compact
                                        (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,
                                         recpubkey.data,iVar6);
                      if (iVar3 == 0) {
                        pcVar7 = 
                        "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigb64, recid2) == 1"
                        ;
                        uStack_560 = 0xf8;
                        goto LAB_00120884;
                      }
                      iVar3 = secp256k1_ecdsa_recover
                                        (CTX,(secp256k1_pubkey *)message,
                                         (secp256k1_ecdsa_recoverable_signature *)sig,msg32);
                      if (iVar3 == 0) {
                        pcVar7 = 
                        "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkey2b, &rsig, msg32) == 1"
                        ;
                        uStack_560 = 0xf9;
                        goto LAB_00120884;
                      }
                      iVar3 = secp256k1_ecdsa_signature_parse_der
                                        (CTX,(secp256k1_ecdsa_signature *)privkey,
                                         (uchar *)&_calls_to_callback_4,0x28);
                      if (iVar3 == 0) {
                        pcVar7 = 
                        "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderlong, sizeof(sigbderlong)) == 1"
                        ;
                        uStack_560 = 0xfb;
                        goto LAB_00120884;
                      }
                      iVar3 = secp256k1_ecdsa_verify
                                        (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                         (secp256k1_pubkey *)&normal_sig);
                      if (iVar3 != 0) {
                        pcVar7 = 
                        "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0"
                        ;
                        uStack_560 = 0xfc;
                        goto LAB_00120884;
                      }
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,sigcder_zr,7);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder_zr, sizeof(sigcder_zr)) == 0"
                      ;
                      uStack_560 = 0x100;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,sigcder_zs,7);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder_zs, sizeof(sigcder_zs)) == 0"
                      ;
                      uStack_560 = 0x101;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,(uchar *)&recid,0x27
                                      );
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt1, sizeof(sigbderalt1)) == 0"
                      ;
                      uStack_560 = 0x103;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,
                                       (uchar *)&_calls_to_callback_12,0x27);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt2, sizeof(sigbderalt2)) == 0"
                      ;
                      uStack_560 = 0x104;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,zero_privkey,0x28);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt3, sizeof(sigbderalt3)) == 0"
                      ;
                      uStack_560 = 0x105;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,(uchar *)&recid_1,
                                       0x28);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt4, sizeof(sigbderalt4)) == 0"
                      ;
                      uStack_560 = 0x106;
                      goto LAB_00120884;
                    }
                    zero_privkey[4] = '\x01';
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,zero_privkey,0x28);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt3, sizeof(sigbderalt3)) == 1"
                      ;
                      uStack_560 = 0x108;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_verify
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                       (secp256k1_pubkey *)&normal_sig);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0"
                      ;
                      uStack_560 = 0x109;
                      goto LAB_00120884;
                    }
                    _recid_1 = CONCAT17(1,_recid_1);
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,(uchar *)&recid_1,
                                       0x28);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbderalt4, sizeof(sigbderalt4)) == 1"
                      ;
                      uStack_560 = 0x10b;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_verify
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                       (secp256k1_pubkey *)&normal_sig);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0"
                      ;
                      uStack_560 = 0x10c;
                      goto LAB_00120884;
                    }
                    sigbder[7] = sigbder[7] + '\x01';
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,sigbder,8);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 1"
                      ;
                      uStack_560 = 0x10f;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_verify
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                       (secp256k1_pubkey *)&normal_sig);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0"
                      ;
                      uStack_560 = 0x110;
                      goto LAB_00120884;
                    }
                    sigbder[7] = sigbder[7] + 0xff;
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,sigbder,6);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, 6) == 0"
                      ;
                      uStack_560 = 0x112;
                      goto LAB_00120884;
                    }
                    iVar6 = secp256k1_ecdsa_signature_parse_der
                                      (CTX,(secp256k1_ecdsa_signature *)privkey,sigbder,7);
                    if (iVar6 != 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder) - 1) == 0"
                      ;
                      uStack_560 = 0x113;
                      goto LAB_00120884;
                    }
                    for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
                      bVar1 = sigbder[lVar10];
                      for (uVar8 = 0; uVar8 != 0x100; uVar8 = uVar8 + 1) {
                        if (bVar1 != uVar8) {
                          sigbder[lVar10] = (uchar)uVar8;
                          iVar6 = secp256k1_ecdsa_signature_parse_der
                                            (CTX,(secp256k1_ecdsa_signature *)privkey,sigbder,8);
                          if ((iVar6 != 0) &&
                             (iVar6 = secp256k1_ecdsa_verify
                                                (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                                 (secp256k1_pubkey *)&normal_sig), iVar6 != 0)) {
                            pcVar7 = 
                            "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigbder, sizeof(sigbder)) == 0 || secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyb) == 0"
                            ;
                            uStack_560 = 0x11d;
                            goto LAB_00120884;
                          }
                        }
                      }
                      sigbder[lVar10] = bVar1;
                    }
                    uVar9 = (ulong)((int)local_4d0 + 1);
                  }
                  _recid_1 = 0x101020101020630;
                  message[0x10] = '\0';
                  message[0x11] = '\0';
                  message[0x12] = '\0';
                  message[0x13] = '\0';
                  message[0x14] = '\0';
                  message[0x15] = '\0';
                  message[0x16] = '\0';
                  message[0x17] = '\0';
                  message[0] = '\0';
                  message[1] = '\0';
                  message[2] = '\0';
                  message[3] = '\0';
                  message[4] = '\0';
                  message[5] = '\0';
                  message[6] = '\0';
                  message[7] = '\0';
                  message[8] = '\0';
                  message[9] = '\0';
                  message[10] = '\0';
                  message[0xb] = '\0';
                  message[0xc] = '\0';
                  message[0xd] = '\0';
                  message[0xe] = '\0';
                  message[0xf] = '\0';
                  message[0x18] = '\0';
                  message[0x19] = '\0';
                  message[0x1a] = '\0';
                  message[0x1b] = '\0';
                  message[0x1c] = '\0';
                  message[0x1d] = '\0';
                  message[0x1e] = '\0';
                  message[0x1f] = '\x01';
                  iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                                    (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,message,0);
                  if (iVar6 == 0) {
                    pcVar7 = 
                    "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1"
                    ;
                    uStack_560 = 0x132;
                  }
                  else {
                    iVar6 = secp256k1_ecdsa_recover
                                      (CTX,(secp256k1_pubkey *)zero_privkey,
                                       (secp256k1_ecdsa_recoverable_signature *)sig,msg32);
                    if (iVar6 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyc, &rsig, msg32) == 1"
                      ;
                      uStack_560 = 0x133;
                    }
                    else {
                      iVar6 = secp256k1_ecdsa_signature_parse_der
                                        (CTX,(secp256k1_ecdsa_signature *)privkey,(uchar *)&recid_1,
                                         8);
                      if (iVar6 == 0) {
                        pcVar7 = 
                        "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1"
                        ;
                        uStack_560 = 0x134;
                      }
                      else {
                        iVar6 = secp256k1_ecdsa_verify
                                          (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                           (secp256k1_pubkey *)zero_privkey);
                        if (iVar6 == 0) {
                          pcVar7 = 
                          "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 1"
                          ;
                          uStack_560 = 0x135;
                        }
                        else {
                          _recid_1 = (uint5)(uint)recid_1;
                          message._24_8_ = message._24_8_ & 0xffffffffffffff;
                          iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                                            (CTX,(secp256k1_ecdsa_recoverable_signature *)sig,
                                             message,0);
                          if (iVar6 == 0) {
                            pcVar7 = 
                            "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1"
                            ;
                            uStack_560 = 0x138;
                          }
                          else {
                            iVar6 = secp256k1_ecdsa_recover
                                              (CTX,(secp256k1_pubkey *)&normal_sig,
                                               (secp256k1_ecdsa_recoverable_signature *)sig,msg32);
                            if (iVar6 == 0) {
                              iVar6 = secp256k1_ecdsa_signature_parse_der
                                                (CTX,(secp256k1_ecdsa_signature *)privkey,
                                                 (uchar *)&recid_1,8);
                              if (iVar6 == 0) {
                                pcVar7 = 
                                "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1"
                                ;
                                uStack_560 = 0x13a;
                              }
                              else {
                                iVar6 = secp256k1_ecdsa_verify
                                                  (CTX,(secp256k1_ecdsa_signature *)privkey,msg32,
                                                   (secp256k1_pubkey *)zero_privkey);
                                if (iVar6 == 0) {
                                  _recid_1 = CONCAT14(1,recid_1);
                                  _recid_1 = _recid_1 & 0xffffffffffffff;
                                  message[0x1f] = '\x01';
                                  iVar6 = secp256k1_ecdsa_recoverable_signature_parse_compact
                                                    (CTX,(secp256k1_ecdsa_recoverable_signature *)
                                                         sig,message,0);
                                  if (iVar6 == 0) {
                                    pcVar7 = 
                                    "test condition failed: secp256k1_ecdsa_recoverable_signature_parse_compact(CTX, &rsig, sigc64, 0) == 1"
                                    ;
                                    uStack_560 = 0x140;
                                  }
                                  else {
                                    iVar6 = secp256k1_ecdsa_recover
                                                      (CTX,(secp256k1_pubkey *)&normal_sig,
                                                       (secp256k1_ecdsa_recoverable_signature *)sig,
                                                       msg32);
                                    if (iVar6 == 0) {
                                      iVar6 = secp256k1_ecdsa_signature_parse_der
                                                        (CTX,(secp256k1_ecdsa_signature *)privkey,
                                                         (uchar *)&recid_1,8);
                                      if (iVar6 == 0) {
                                        pcVar7 = 
                                        "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, sigcder, sizeof(sigcder)) == 1"
                                        ;
                                        uStack_560 = 0x142;
                                      }
                                      else {
                                        iVar6 = secp256k1_ecdsa_verify
                                                          (CTX,(secp256k1_ecdsa_signature *)privkey,
                                                           msg32,(secp256k1_pubkey *)zero_privkey);
                                        if (iVar6 == 0) {
                                          return;
                                        }
                                        pcVar7 = 
                                        "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 0"
                                        ;
                                        uStack_560 = 0x143;
                                      }
                                    }
                                    else {
                                      pcVar7 = 
                                      "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 0"
                                      ;
                                      uStack_560 = 0x141;
                                    }
                                  }
                                }
                                else {
                                  pcVar7 = 
                                  "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg32, &pubkeyc) == 0"
                                  ;
                                  uStack_560 = 0x13b;
                                }
                              }
                            }
                            else {
                              pcVar7 = 
                              "test condition failed: secp256k1_ecdsa_recover(CTX, &pubkeyb, &rsig, msg32) == 0"
                              ;
                              uStack_560 = 0x139;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  pcVar7 = 
                  "test condition failed: !secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)";
                  uStack_560 = 0xc5;
                }
              }
            }
            else {
              pcVar7 = "test condition failed: !secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)"
              ;
              uStack_560 = 0xc3;
            }
          }
        }
      }
    }
    else {
      pcVar7 = "test condition failed: !secp256k1_ecdsa_recover(CTX, &pubkey, &rsig, msg32)";
      uStack_560 = 0xbf;
    }
  }
LAB_00120884:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/recovery/tests_impl.h"
          ,uStack_560,pcVar7);
  abort();
}

Assistant:

static void run_recovery_tests(void) {
    int i;
    for (i = 0; i < COUNT; i++) {
        test_ecdsa_recovery_api();
    }
    for (i = 0; i < 64*COUNT; i++) {
        test_ecdsa_recovery_end_to_end();
    }
    test_ecdsa_recovery_edge_cases();
}